

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree.cpp
# Opt level: O3

void calculate_factors(int *factors,int num_dims,int *stencil,int stencil_size)

{
  int *piVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  if (0 < num_dims) {
    uVar2 = 0;
    do {
      factors[uVar2] = 0;
      if (0 < stencil_size) {
        iVar3 = 0;
        piVar1 = stencil;
        uVar4 = (ulong)(uint)stencil_size;
        do {
          if (*piVar1 != 0) {
            iVar3 = iVar3 + 1;
            factors[uVar2] = iVar3;
          }
          piVar1 = piVar1 + (uint)num_dims;
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
      uVar2 = uVar2 + 1;
      stencil = stencil + 1;
    } while (uVar2 != (uint)num_dims);
  }
  return;
}

Assistant:

void calculate_factors(int *factors, int num_dims, const int *stencil, int stencil_size) {
    for (int d = 0; d < num_dims; d++) {
        factors[d] = 0;
        for (int i = 0; i < stencil_size; ++i) {

            if (stencil[(i * num_dims) + d] != 0) {
                factors[d]++;
            }
        }
    }
}